

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

uint64 __thiscall google::protobuf::internal::ArenaImpl::Reset(ArenaImpl *this)

{
  uint64 uVar1;
  ArenaImpl *unaff_retaddr;
  uint64 space_allocated;
  ArenaImpl *in_stack_00000038;
  ArenaImpl *in_stack_fffffffffffffff0;
  
  CleanupList(in_stack_fffffffffffffff0);
  uVar1 = FreeBlocks(unaff_retaddr);
  Init(in_stack_00000038);
  return uVar1;
}

Assistant:

uint64 ArenaImpl::Reset() {
  // Have to do this in a first pass, because some of the destructors might
  // refer to memory in other blocks.
  CleanupList();
  uint64 space_allocated = FreeBlocks();
  Init();

  return space_allocated;
}